

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void duckdb::TemplatedWritePlain<duckdb::uhugeint_t,double,duckdb::ParquetUhugeintOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  double *result;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  uhugeint_t input;
  double local_write [2048];
  undefined8 local_4040;
  undefined8 local_4038 [2049];
  
  if (stats < chunk_start) {
    p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(&(col->type).id_ + (long)stats * 0x10);
    lVar2 = 0;
    result = (double *)chunk_end;
    do {
      if ((*(long *)chunk_end == 0) ||
         (result = (double *)((ulong)stats >> 6),
         (*(ulong *)(*(long *)chunk_end + (long)result * 8) >> ((ulong)stats & 0x3f) & 1) != 0)) {
        local_4040 = 0;
        input.upper = (uint64_t)&local_4040;
        input.lower = (uint64_t)p_Var1->_M_pi;
        Uhugeint::TryCast<double>(*(Uhugeint **)(p_Var1 + -1),input,result);
        local_4038[lVar2] = local_4040;
        lVar2 = lVar2 + 1;
        if (lVar2 == 0x800) {
          (*(code *)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)
                    (mask,local_4038,0x4000);
          lVar2 = 0;
        }
      }
      stats = (ColumnWriterStatistics *)((long)&stats->_vptr_ColumnWriterStatistics + 1);
      p_Var1 = p_Var1 + 2;
    } while ((ColumnWriterStatistics *)chunk_start != stats);
    lVar2 = lVar2 << 3;
  }
  else {
    lVar2 = 0;
  }
  (*(code *)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)
            (mask,local_4038,lVar2);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}